

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_name.cc
# Opt level: O1

bool bssl::ConvertToRFC2253(RDNSequence *rdn_sequence,string *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pXVar4;
  bool bVar5;
  long lVar6;
  pointer this;
  ulong uVar7;
  bool bVar8;
  string rdn_string;
  RelativeDistinguishedName rdn;
  string atv_string;
  string rdns_string;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_> local_b0;
  string local_98;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  ulong local_58;
  ulong local_50;
  long local_48;
  RDNSequence *local_40;
  string *local_38;
  
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  pvVar2 = (rdn_sequence->
           super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = (rdn_sequence->
           super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)pvVar2 - (long)pvVar3;
  bVar8 = lVar6 == 0;
  local_38 = out;
  if (!bVar8) {
    local_50 = ((long)pvVar2 - (long)pvVar3 >> 3) * -0x5555555555555555;
    local_58 = local_50 + (local_50 == 0);
    paVar1 = &local_98.field_2;
    uVar7 = 0;
    local_48 = lVar6;
    local_40 = rdn_sequence;
    do {
      ::std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>::vector
                (&local_b0,
                 (vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_> *)
                 ((long)&(local_40->
                         super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[~uVar7].
                         super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                         ._M_impl.super__Vector_impl_data + local_48));
      pXVar4 = local_b0.
               super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_d0 = &local_c0;
      local_c8 = 0;
      local_c0 = 0;
      for (this = local_b0.
                  super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                  ._M_impl.super__Vector_impl_data._M_start; this != pXVar4; this = this + 1) {
        if (local_c8 != 0) {
          ::std::__cxx11::string::append((char *)&local_d0);
        }
        local_98._M_string_length = 0;
        local_98.field_2._M_local_buf[0] = '\0';
        local_98._M_dataplus._M_p = (pointer)paVar1;
        bVar5 = X509NameAttribute::AsRFC2253String(this,&local_98);
        if (!bVar5) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p,
                            CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                     local_98.field_2._M_local_buf[0]) + 1);
          }
LAB_004b3d32:
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
          }
          if (local_b0.
              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
              _M_impl.super__Vector_impl_data._M_start != (X509NameAttribute *)0x0) {
            operator_delete(local_b0.
                            super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_b0.
                                  super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.
                                  super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          goto LAB_004b3d6a;
        }
        ::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_98._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                   local_98.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar5) goto LAB_004b3d32;
      }
      if (local_70 != 0) {
        ::std::__cxx11::string::append((char *)&local_78);
      }
      ::std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_d0);
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
      }
      if (local_b0.
          super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
          _M_impl.super__Vector_impl_data._M_start != (X509NameAttribute *)0x0) {
        operator_delete(local_b0.
                        super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b0.
                              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.
                              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (this != pXVar4) goto LAB_004b3d6a;
      uVar7 = uVar7 + 1;
      bVar8 = local_50 <= uVar7;
    } while (uVar7 != local_58);
  }
  ::std::__cxx11::string::_M_assign((string *)local_38);
LAB_004b3d6a:
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return bVar8;
}

Assistant:

bool ParseNameValue(der::Input name_value, RDNSequence *out) {
  der::Parser rdn_sequence_parser(name_value);
  while (rdn_sequence_parser.HasMore()) {
    der::Parser rdn_parser;
    if (!rdn_sequence_parser.ReadConstructed(CBS_ASN1_SET, &rdn_parser)) {
      return false;
    }
    RelativeDistinguishedName type_and_values;
    if (!ReadRdn(&rdn_parser, &type_and_values)) {
      return false;
    }
    out->push_back(type_and_values);
  }

  return true;
}